

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O3

char * TEST_triple_parse_unknown(void)

{
  char **ppcVar1;
  size_t sVar2;
  int iVar3;
  char *pcVar4;
  char *__ptr;
  long lVar5;
  cargo_t cargo;
  char *s;
  float c;
  int b;
  int a;
  char *args2 [1];
  char *args3 [2];
  char *args [3];
  cargo_t local_80;
  char *local_78;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  char *local_60;
  char *local_58;
  char *pcStack_50;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  
  iVar3 = cargo_init(&local_80,0,"program");
  if (iVar3 != 0) {
    return "Failed to init cargo";
  }
  local_38 = "123";
  local_48 = "program";
  pcStack_40 = "--unknown1";
  local_60 = "program";
  local_58 = "program";
  pcStack_50 = "--unknown2";
  local_64 = 0;
  local_68 = 0;
  local_6c = 0x40e00000;
  local_78 = strdup("abc");
  if (local_78 == (char *)0x0) {
    pcVar4 = "Failed to allocate";
    goto LAB_00121538;
  }
  cargo_add_option(local_80,0,"--alpha -a","an option","i",&local_64);
  cargo_add_option(local_80,0,"--beta -b","another option","i",&local_68);
  cargo_add_option(local_80,0,"--centauri -c","another option","f",&local_6c);
  cargo_add_option(local_80,0,"--delta -d","another option","s",&local_78);
  iVar3 = cargo_parse(local_80,CARGO_SKIP_CHECK_UNKNOWN,1,3,&local_48);
  __ptr = local_78;
  if (iVar3 == 0) {
    if (local_78 == (char *)0x0) {
LAB_00121531:
      pcVar4 = "Expected s to be \'abc\'";
      goto LAB_00121538;
    }
    iVar3 = strcmp(local_78,"abc");
    if (iVar3 == 0) {
      iVar3 = cargo_parse(local_80,CARGO_SKIP_CHECK_UNKNOWN,1,1,&local_60);
      __ptr = local_78;
      if (iVar3 == 0) {
        if (local_78 == (char *)0x0) goto LAB_00121531;
        iVar3 = strcmp(local_78,"abc");
        if (iVar3 != 0) goto LAB_00121497;
        iVar3 = cargo_parse(local_80,0,1,2,&local_58);
        if (iVar3 < 0) {
          if (local_80 == (cargo_t)0x0) {
            __assert_fail("ctx",
                          "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                          ,0x14ff,"const char **cargo_get_unknown(cargo_t, size_t *)");
          }
          ppcVar1 = local_80->unknown_opts;
          if (ppcVar1 == (char **)0x0) {
            pcVar4 = "Got NULL unknown options";
          }
          else {
            sVar2 = local_80->unknown_opts_count;
            printf("Unknown option count = %lu\n",sVar2);
            puts("Check that \"unknown_opts\" has 1 elements");
            if (sVar2 == 1) {
              lVar5 = 1;
              pcVar4 = "Array contains unexpected value";
              do {
                if (lVar5 == 2) {
                  pcVar4 = (char *)0x0;
                  break;
                }
                printf("  %lu: \"%s\" -> \"%s\"\n",lVar5,ppcVar1[lVar5 + -1],"--unknown2");
                iVar3 = strcmp(ppcVar1[lVar5 + -1],"--unknown2");
                lVar5 = lVar5 + 1;
              } while (iVar3 == 0);
            }
            else {
              pcVar4 = "unknown_opts array count unknown_count is not expected 1";
            }
          }
        }
        else {
          pcVar4 = "Parse did not fail 3";
        }
      }
      else {
        pcVar4 = "Parse failed 2";
      }
      goto LAB_0012145b;
    }
LAB_00121497:
    pcVar4 = "Expected s to be \'abc\'";
  }
  else {
    pcVar4 = "Parse failed 1";
LAB_0012145b:
    __ptr = local_78;
    if (local_78 == (char *)0x0) goto LAB_00121538;
  }
  if (replaced_cargo_free == (cargo_free_f)0x0) {
    free(__ptr);
  }
  else {
    (*replaced_cargo_free)(__ptr);
  }
LAB_00121538:
  cargo_destroy(&local_80);
  return pcVar4;
}

Assistant:

_TEST_START(TEST_triple_parse_unknown)
{
    //
    // Specify two unknowns in different parses, but don't check for the first.
    //
    char *args[] = { "program", "--unknown1", "123" };
    char *args2[] = { "program" };
    char *args3[] = { "program", "--unknown2" };
    char *unknown_opts_expect[] = { "--unknown2" };
    size_t unknown_count = 0;
    const char **unknown_opts = NULL;
    int a = 0;
    int b = 0;
    float c = 7.0f;
    char *s = strdup("abc");
    cargo_assert(s, "Failed to allocate");

    ret |= cargo_add_option(cargo, 0, "--alpha -a", "an option", "i", &a);
    ret |= cargo_add_option(cargo, 0, "--beta -b", "another option", "i", &b);
    ret |= cargo_add_option(cargo, 0, "--centauri -c", "another option", "f", &c);
    ret |= cargo_add_option(cargo, 0, "--delta -d", "another option", "s", &s);

    ret = cargo_parse(cargo, CARGO_SKIP_CHECK_UNKNOWN, 1, sizeof(args) / sizeof(args[0]), args);
    cargo_assert(ret == 0, "Parse failed 1");
    cargo_assert(s && !strcmp(s, "abc"), "Expected s to be 'abc'");

    ret = cargo_parse(cargo, CARGO_SKIP_CHECK_UNKNOWN, 1, sizeof(args2) / sizeof(args2[0]), args2);
    cargo_assert(ret == 0, "Parse failed 2");
    cargo_assert(s && !strcmp(s, "abc"), "Expected s to be 'abc'");

    ret = cargo_parse(cargo, 0, 1, sizeof(args3) / sizeof(args3[0]), args3);
    cargo_assert(ret < 0, "Parse did not fail 3");

    // Get unknown options.
    unknown_opts = cargo_get_unknown(cargo, &unknown_count);
    cargo_assert(unknown_opts != NULL, "Got NULL unknown options");

    printf("Unknown option count = %lu\n", unknown_count);
    cargo_assert_str_array(unknown_count, 1, unknown_opts, unknown_opts_expect);


    _TEST_CLEANUP();
    _cargo_xfree(&s);
}